

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O1

int init(EVP_PKEY_CTX *ctx)

{
  byte *pbVar1;
  int extraout_EAX;
  Symbol *pSVar2;
  long lVar3;
  char *pcVar4;
  
  symbol_init();
  pcVar4 = "VERBATIM";
  lVar3 = 0x10;
  do {
    pSVar2 = install(pcVar4,(int)*(short *)((long)&__do_global_dtors_aux_fini_array_entry + lVar3));
    pSVar2->subtype = 1;
    pcVar4 = *(char **)((long)&keywords[0].name + lVar3);
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x5c0);
  pcVar4 = "adams";
  lVar3 = 0x18;
  do {
    pSVar2 = install(pcVar4,0x129);
    pcVar4 = *(char **)((long)&methods[0].name + lVar3);
    pSVar2->subtype = *(long *)((long)&keywords[0x5b].name + lVar3);
    *(int *)&pSVar2->u = (int)*(short *)((long)&keywords[0x5b].kval + lVar3);
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x1e0);
  pcVar4 = ";";
  lVar3 = 0x18;
  do {
    pSVar2 = install(pcVar4,1);
    pcVar4 = *(char **)((long)&special[0].name + lVar3);
    **(undefined8 **)((long)&methods[0x13].varstep + lVar3) = pSVar2;
    pSVar2->subtype = (long)*(short *)((long)&methods[0x13].subtype + lVar3);
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x60);
  lVar3 = 0;
  do {
    pSVar2 = install(*(char **)((long)extdef + lVar3),0x13e);
    pSVar2->subtype = 0x8000;
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x220);
  lVar3 = 0;
  do {
    pSVar2 = install(*(char **)((long)extdef2 + lVar3),0x13e);
    pSVar2->subtype = 0x40000;
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    pSVar2 = lookup(*(char **)((long)extdef3 + lVar3));
    if ((pSVar2 == (Symbol *)0x0) || (-1 < (short)pSVar2->subtype)) {
      __assert_fail("s && (s->subtype & EXTDEF)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/init.c"
                    ,0xfd,"void init()");
    }
    pSVar2->subtype = pSVar2->subtype | 0x100000;
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x58);
  pSVar2 = lookup("at_time");
  if ((pSVar2 != (Symbol *)0x0) && ((short)pSVar2->subtype < 0)) {
    pSVar2->subtype = pSVar2->subtype | 0x400000;
    lVar3 = 0;
    do {
      pSVar2 = lookup(*(char **)((long)extdef5 + lVar3));
      if (pSVar2 == (Symbol *)0x0) {
        __assert_fail("s",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/init.c"
                      ,0x107,"void init()");
      }
      pbVar1 = (byte *)((long)&pSVar2->subtype + 2);
      *pbVar1 = *pbVar1 | 0x80;
      lVar3 = lVar3 + 8;
    } while (lVar3 != 0x98);
    intoken = newlist();
    initfunc = newlist();
    modelfunc = newlist();
    termfunc = newlist();
    procfunc = newlist();
    initlist = newlist();
    firstlist = newlist();
    syminorder = newlist();
    plotlist = newlist();
    constructorfunc = newlist();
    destructorfunc = newlist();
    units_def_for_acc = newlist();
    nrninit();
    return extraout_EAX;
  }
  __assert_fail("s && (s->subtype & EXTDEF)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/init.c"
                ,0x102,"void init()");
}

Assistant:

void init()
{
	int             i;
	Symbol         *s;

	symbol_init();
	for (i = 0; keywords[i].name; i++) {
		s = install(keywords[i].name, keywords[i].kval);
		s->subtype = KEYWORD;
	}
	for (i = 0; methods[i].name; i++) {
		s = install(methods[i].name, METHOD);
		s->subtype = methods[i].subtype;
		s->u.i = methods[i].varstep;
	}
	for (i = 0; special[i].name; i++) {
		s = install(special[i].name, SPECIAL);
		*(special[i].p) = s;
		s->subtype = special[i].subtype;
	}
	for (i = 0; extdef[i]; i++) {
		s = install(extdef[i], NAME);
		s->subtype = EXTDEF;
	}
	for (i = 0; extdef2[i]; i++) {
		s = install(extdef2[i], NAME);
		s->subtype = EXTDEF2;
	}
	for (i = 0; extdef3[i]; i++) {
		s = lookup(extdef3[i]);
		assert(s && (s->subtype & EXTDEF));
		s->subtype |= EXTDEF3;
	}
	for (i = 0; extdef4[i]; i++) {
		s = lookup(extdef4[i]);
		assert(s && (s->subtype & EXTDEF));
		s->subtype |= EXTDEF4;
	}
	for (i = 0; extdef5[i]; i++) {
		s = lookup(extdef5[i]);
		assert(s);
		s->subtype |= EXTDEF5;
	}
	intoken = newlist();
	initfunc = newlist();
	modelfunc = newlist();
	termfunc = newlist();
	procfunc = newlist();
	initlist = newlist();
	firstlist = newlist();
	syminorder = newlist();
	plotlist = newlist();
	constructorfunc = newlist();
	destructorfunc = newlist();
	units_def_for_acc = newlist();
#if NMODL
	nrninit();
#endif
}